

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_address_impl.c
# Opt level: O0

cio_error cio_init_inet_socket_address
                    (cio_socket_address *sock_address,cio_inet_address *inet_address,uint16_t port)

{
  cio_address_family cVar1;
  uint16_t uVar2;
  cio_address_family family;
  uint16_t port_local;
  cio_inet_address *inet_address_local;
  cio_socket_address *sock_address_local;
  
  if (sock_address == (cio_socket_address *)0x0 || inet_address == (cio_inet_address *)0x0) {
    sock_address_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    cVar1 = (inet_address->impl).family;
    if (cVar1 == CIO_ADDRESS_FAMILY_INET4 || cVar1 == CIO_ADDRESS_FAMILY_INET6) {
      if (cVar1 == CIO_ADDRESS_FAMILY_INET4) {
        memset(&(sock_address->impl).sa,0,0x10);
        *(in_addr_t *)((long)&(sock_address->impl).sa + 4) = (inet_address->impl).field_1.in.s_addr;
        uVar2 = cio_htobe16(port);
        *(uint16_t *)(sock_address->impl).sa.socket_address.addr.sa_data = uVar2;
        (sock_address->impl).len = 0x10;
      }
      else {
        memset(&(sock_address->impl).sa,0,0x1c);
        *(undefined8 *)((long)&(sock_address->impl).sa + 8) =
             *(undefined8 *)&(inet_address->impl).field_1;
        *(undefined8 *)((long)&(sock_address->impl).sa + 0x10) =
             *(undefined8 *)((long)&(inet_address->impl).field_1 + 8);
        uVar2 = cio_htobe16(port);
        *(uint16_t *)(sock_address->impl).sa.socket_address.addr.sa_data = uVar2;
        (sock_address->impl).len = 0x1c;
      }
      (sock_address->impl).sa.socket_address.addr.sa_family = (sa_family_t)cVar1;
      sock_address_local._4_4_ = CIO_SUCCESS;
    }
    else {
      sock_address_local._4_4_ = CIO_ADDRESS_FAMILY_NOT_SUPPORTED;
    }
  }
  return sock_address_local._4_4_;
}

Assistant:

enum cio_error cio_init_inet_socket_address(struct cio_socket_address *sock_address, const struct cio_inet_address *inet_address, uint16_t port)
{
	if (cio_unlikely((sock_address == NULL) || (inet_address == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	enum cio_address_family family = inet_address->impl.family;
	if (cio_unlikely((family != CIO_ADDRESS_FAMILY_INET4) && (family != CIO_ADDRESS_FAMILY_INET6))) {
		return CIO_ADDRESS_FAMILY_NOT_SUPPORTED;
	}

	if (family == CIO_ADDRESS_FAMILY_INET4) {
		memset(&sock_address->impl.sa.inet_addr4.impl.in, 0x0, sizeof(sock_address->impl.sa.inet_addr4.impl.in));
		memcpy(&sock_address->impl.sa.inet_addr4.impl.in.sin_addr, &inet_address->impl.in.s_addr, sizeof(inet_address->impl.in.s_addr));
		sock_address->impl.sa.inet_addr4.impl.in.sin_port = cio_htobe16(port);
		sock_address->impl.len = (socklen_t)sizeof(sock_address->impl.sa.inet_addr4.impl.in);
	} else {
		memset(&sock_address->impl.sa.inet_addr6.impl.in6, 0x0, sizeof(sock_address->impl.sa.inet_addr6.impl.in6));
		memcpy(sock_address->impl.sa.inet_addr6.impl.in6.sin6_addr.s6_addr, inet_address->impl.in6.s6_addr, sizeof(inet_address->impl.in6.s6_addr));
		sock_address->impl.sa.inet_addr6.impl.in6.sin6_port = cio_htobe16(port);
		sock_address->impl.len = (socklen_t)sizeof(sock_address->impl.sa.inet_addr6.impl.in6);
	}

	sock_address->impl.sa.socket_address.addr.sa_family = (sa_family_t)family;

	return CIO_SUCCESS;
}